

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

TaskSpec * __thiscall Database::allocate_task(Database *this)

{
  TaskSpec *pTVar1;
  allocator<char> local_6a;
  allocator<char> local_69;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  local_68;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"N/A",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"N/A",&local_6a);
  local_68.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = allocate_task(this,&local_30,&local_50,&local_68);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return pTVar1;
}

Assistant:

TaskSpec *Database::allocate_task() { return allocate_task("N/A", "N/A", {}); }